

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifticdf.c
# Opt level: O0

double gamma_pq2s(pqpair pq,double sh,double sc)

{
  double local_68;
  double bound;
  double scale;
  double shape;
  double x;
  double q;
  double p;
  int status;
  int which;
  double sc_local;
  double sh_local;
  pqpair pq_local;
  
  x = pq.q;
  q = pq.p;
  p._4_4_ = 2;
  if (0.0 < q) {
    if (0.0 < x) {
      shape = 0.0;
      bound = sc;
      scale = sh;
      _status = sc;
      sc_local = sh;
      sh_local = q;
      pq_local.p = x;
      cdfgam((int *)((long)&p + 4),&q,&x,&shape,&scale,&bound,(int *)&p,&local_68);
      pq_local.q = shape;
    }
    else {
      pq_local.q = 9.99e+37;
    }
  }
  else {
    pq_local.q = 0.0;
  }
  return pq_local.q;
}

Assistant:

static double gamma_pq2s( pqpair pq , double sh , double sc )
{
   int which , status ;
   double p,q, x,shape,scale,bound ;

   which  = 2 ;
   p      = pq.p ; if( p <= 0.0 ) return  0.0 ;
   q      = pq.q ; if( q <= 0.0 ) return BIGG ;
   x      = 0.0 ;
   shape  = sh ;
   scale  = sc ;

   cdfgam( &which , &p , &q , &x , &shape , &scale , &status , &bound ) ;
   return x ;
}